

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

FConfigFile * __thiscall FConfigFile::operator=(FConfigFile *this,FConfigFile *other)

{
  char *name;
  FConfigSection *section;
  FConfigEntry *local_30;
  FConfigEntry *fromentry;
  FConfigSection *tosection;
  FConfigSection *fromsection;
  FConfigFile *other_local;
  FConfigFile *this_local;
  
  ClearConfig(this);
  for (tosection = other->Sections; tosection != (FConfigSection *)0x0; tosection = tosection->Next)
  {
    local_30 = tosection->RootEntry;
    name = FString::operator_cast_to_char_(&tosection->SectionName);
    section = NewConfigSection(this,name);
    for (; local_30 != (FConfigEntry *)0x0; local_30 = local_30->Next) {
      NewConfigEntry(this,section,local_30->Key,local_30->Value);
    }
  }
  return this;
}

Assistant:

FConfigFile &FConfigFile::operator = (const FConfigFile &other)
{
	FConfigSection *fromsection, *tosection;
	FConfigEntry *fromentry;

	ClearConfig ();
	fromsection = other.Sections;
	while (fromsection != NULL)
	{
		fromentry = fromsection->RootEntry;
		tosection = NewConfigSection (fromsection->SectionName);
		while (fromentry != NULL)
		{
			NewConfigEntry (tosection, fromentry->Key, fromentry->Value);
			fromentry = fromentry->Next;
		}
		fromsection = fromsection->Next;
	}
	return *this;
}